

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::verify_piece(torrent *this,piece_index_t piece)

{
  uint uVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  piece_index_t piece_00;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  file_storage *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char cVar9;
  char cVar10;
  vector<sha256_hash> hashes;
  vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> local_e8;
  uint local_d0;
  piece_index_t local_cc;
  undefined1 local_c8 [16];
  void *local_b8;
  pointer pdStack_b0;
  pointer local_a8;
  long *local_98;
  pointer local_90;
  ulong *local_88;
  undefined8 uStack_80;
  code *local_78;
  code *pcStack_70;
  sha1_hash local_68;
  vector<sha256_hash> local_48;
  
  iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x2e])();
  local_c8._0_8_ = CONCAT44(extraout_var,iVar8) + 0x438;
  local_c8._8_8_ = local_c8._8_8_ & 0xffffffffffffff00;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_c8);
  local_c8[8] = 1;
  iVar8 = *(int *)(CONCAT44(extraout_var,iVar8) + 0x238);
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_c8);
  cVar9 = -0x70;
  if (iVar8 != 2) {
    cVar9 = '\0';
  }
  cVar10 = -0x80;
  if (iVar8 != 3) {
    cVar10 = cVar9;
  }
  bVar7 = digest32<160L>::is_all_zeros
                    (&(((this->super_torrent_hot_members).m_torrent_file.
                        super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->m_info_hash).v1);
  cVar9 = cVar10 + ' ';
  if (bVar7) {
    cVar9 = cVar10;
  }
  local_e8.
  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.
  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar7 = digest32<256L>::is_all_zeros
                    (&(((this->super_torrent_hot_members).m_torrent_file.
                        super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->m_info_hash).v2);
  if (!bVar7) {
    this_00 = torrent_info::orig_files
                        ((this->super_torrent_hot_members).m_torrent_file.
                         super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
    iVar8 = file_storage::blocks_in_piece2(this_00,piece);
    ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::resize
              (&local_e8,(long)iVar8);
  }
  iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x2e])();
  local_c8._0_8_ = CONCAT44(extraout_var_00,iVar8) + 0x438;
  local_c8._8_8_ = local_c8._8_8_ & 0xffffffffffffff00;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_c8);
  local_c8[8] = 1;
  uVar1 = *(uint *)(CONCAT44(extraout_var_00,iVar8) + 0x428);
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_c8);
  pdVar3 = local_e8.
           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pdVar2 = local_e8.
           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((uVar1 >> 0x16 & 1) == 0) {
    iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [4])();
    local_98 = (long *)CONCAT44(extraout_var_01,iVar8);
    local_90 = pdVar2;
    local_d0 = (this->m_storage).m_idx.m_val;
    local_cc.m_val = piece.m_val;
    ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::aux::torrent,void>
              ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)local_c8,
               (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
    pdVar5 = local_e8.
             super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pdVar4 = local_e8.
             super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pdVar2 = local_e8.
             super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_b8 = local_e8.
               super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    pdStack_b0 = local_e8.
                 super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    local_a8 = local_e8.
               super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_e8.
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88 = (ulong *)0x0;
    uStack_80 = 0;
    local_78 = (code *)0x0;
    pcStack_70 = (code *)0x0;
    local_88 = (ulong *)operator_new(0x28);
    uVar6 = local_c8._8_8_;
    piece_00.m_val = local_cc.m_val;
    local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *local_88 = local_c8._0_8_;
    local_88[1] = uVar6;
    local_c8._0_8_ = (mutex_type *)0x0;
    local_88[2] = (ulong)pdVar2;
    local_88[3] = (ulong)pdVar4;
    local_88[4] = (ulong)pdVar5;
    local_a8 = (pointer)0x0;
    local_b8 = (void *)0x0;
    pdStack_b0 = (pointer)0x0;
    pcStack_70 = ::std::
                 _Function_handler<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_const_libtorrent::digest32<160L>_&,_const_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:11402:6)>
                 ::_M_invoke;
    local_78 = ::std::
               _Function_handler<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_const_libtorrent::digest32<160L>_&,_const_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:11402:6)>
               ::_M_manager;
    (**(code **)(*local_98 + 0x20))
              (local_98,local_d0,local_cc.m_val,local_90,(long)pdVar3 - (long)local_90 >> 5,cVar9,
               &local_88);
    if (local_78 != (code *)0x0) {
      (*local_78)(&local_88,&local_88,3);
    }
    if (local_b8 != (void *)0x0) {
      operator_delete(local_b8,(long)local_a8 - (long)local_b8);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
    }
    piece_picker::started_hash_job
              ((this->super_torrent_hot_members).m_picker._M_t.
               super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
               ._M_t.
               super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
               .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,piece_00)
    ;
    (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x1f])
              ();
  }
  else {
    piece_picker::started_hash_job
              ((this->super_torrent_hot_members).m_picker._M_t.
               super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
               ._M_t.
               super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
               .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,piece);
    pdVar3 = local_e8.
             super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pdVar2 = local_e8.
             super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_48.super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_e8.
         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_48.super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_e8.
         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_48.super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_e8.
         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_e8.
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.m_number._M_elems[4] = 0;
    local_68.m_number._M_elems[0] = 0;
    local_68.m_number._M_elems[1] = 0;
    local_68.m_number._M_elems[2] = 0;
    local_68.m_number._M_elems[3] = 0;
    local_c8._0_8_ = local_c8._0_8_ & 0xffffff0000000000;
    local_c8._8_8_ = &boost::system::detail::cat_holder<void>::system_category_instance;
    local_b8 = (void *)CONCAT44(local_b8._4_4_,0xffffff);
    on_piece_verified(this,&local_48,piece,&local_68,(storage_error *)local_c8);
    if (pdVar2 != (pointer)0x0) {
      operator_delete(pdVar2,(long)pdVar3 - (long)pdVar2);
    }
  }
  if (local_e8.
      super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.
                    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.
                          super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.
                          super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void torrent::verify_piece(piece_index_t const piece)
	{
		TORRENT_ASSERT(m_storage);
		TORRENT_ASSERT(!m_picker->is_hashing(piece));

		// we just completed the piece, it should be flushed to disk
		disk_job_flags_t flags{};

		auto const write_mode = settings().get_int(settings_pack::disk_io_write_mode);
		if (write_mode == settings_pack::write_through)
			flags |= disk_interface::flush_piece;
		else if (write_mode == settings_pack::disable_os_cache)
			flags |= disk_interface::flush_piece | disk_interface::volatile_read;
		if (torrent_file().info_hashes().has_v1())
			flags |= disk_interface::v1_hash;

		aux::vector<sha256_hash> hashes;
		if (torrent_file().info_hashes().has_v2())
		{
			hashes.resize(torrent_file().orig_files().blocks_in_piece2(piece));
		}

		if (settings().get_bool(settings_pack::disable_hash_checks))
		{
			// short-circuit the hash check if it's disabled
			m_picker->started_hash_job(piece);
			on_piece_verified(std::move(hashes), piece, sha1_hash(), storage_error{});
			return;
		}

		span<sha256_hash> v2_span(hashes);
		m_ses.disk_thread().async_hash(m_storage, piece, v2_span, flags
			, [self = shared_from_this(), hashes1 = std::move(hashes)]
			(piece_index_t p, sha1_hash const& h, storage_error const& error) mutable
			{ self->on_piece_verified(std::move(hashes1), p, h, error); });
		m_picker->started_hash_job(piece);
		m_ses.deferred_submit_jobs();
	}